

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ta.cc
# Opt level: O2

state_status_t
tchecker::ta::initialize
          (system_t *system,vloc_sptr_t *vloc,intval_sptr_t *intval,vedge_sptr_t *vedge,
          sync_id_t *sync_id,clock_constraint_container_t *invariant,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *attributes)

{
  uint uVar1;
  state_status_t sVar2;
  integer_t iVar3;
  intval_t *piVar4;
  mapped_type *str;
  make_shared_t<tchecker::vloc_t,_unsigned_long,_1UL> *pmVar5;
  bytecode_t *bytecode;
  long lVar6;
  allocator<char> local_61;
  intval_sptr_t *local_60;
  clock_constraint_container_t *local_58;
  key_type local_50;
  
  local_58 = invariant;
  sVar2 = syncprod::initialize(&system->super_system_t,vloc,vedge,sync_id,attributes);
  if (sVar2 == 1) {
    piVar4 = &intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::intval_t,_unsigned_long,_1UL>_>
              ::operator*(intval)->super_intval_t;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"intval",&local_61);
    local_60 = intval;
    str = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::at(attributes,&local_50);
    from_string(piVar4,&(system->super_system_t).super_system_t.super_intvars_t._integer_variables.
                        super_array_variables_t<unsigned_int,_tchecker::intvar_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._flattened_variables,str);
    std::__cxx11::string::~string((string *)&local_50);
    pmVar5 = intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::vloc_t,_unsigned_long,_1UL>_>
             ::operator*(vloc);
    uVar1 = (pmVar5->super_vloc_t).super_loc_array_t.super_vloc_base_t.
            super_array_capacity_t<unsigned_int>._capacity;
    lVar6 = 0;
    while( true ) {
      if ((ulong)uVar1 << 2 == lVar6) {
        return 1;
      }
      bytecode = system_t::invariant_bytecode
                           (system,*(loc_id_t *)
                                    (&(pmVar5->super_vloc_t).super_loc_array_t._fam.field_0x0 +
                                    lVar6));
      piVar4 = &intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::intval_t,_unsigned_long,_1UL>_>
                ::operator*(local_60)->super_intval_t;
      iVar3 = vm_t::run(&system->_vm,bytecode,piVar4,local_58,
                        (clock_reset_container_t *)&place_holder_clkreset);
      if (iVar3 == 0) break;
      lVar6 = lVar6 + 4;
      if (place_holder_clkreset != DAT_002306e0) {
        __assert_fail("place_holder_clkreset.empty()",
                      "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/ta/ta.cc"
                      ,0x15c,
                      "tchecker::state_status_t tchecker::ta::initialize(const tchecker::ta::system_t &, const tchecker::vloc_sptr_t &, const tchecker::intval_sptr_t &, const tchecker::vedge_sptr_t &, tchecker::sync_id_t &, tchecker::clock_constraint_container_t &, const std::map<std::string, std::string> &)"
                     );
      }
    }
    sVar2 = 8;
  }
  return sVar2;
}

Assistant:

tchecker::state_status_t initialize(tchecker::ta::system_t const & system, tchecker::vloc_sptr_t const & vloc,
                                    tchecker::intval_sptr_t const & intval, tchecker::vedge_sptr_t const & vedge,
                                    tchecker::sync_id_t & sync_id, tchecker::clock_constraint_container_t & invariant,
                                    std::map<std::string, std::string> const & attributes)
{
  // intialize vloc and vedge from syncprod
  auto status = tchecker::syncprod::initialize(system.as_syncprod_system(), vloc, vedge, sync_id, attributes);
  if (status != STATE_OK)
    return status;

  // initialize intval
  try {
    tchecker::from_string(*intval, system.integer_variables().flattened(), attributes.at("intval"));
  }
  catch (...) {
    return tchecker::STATE_BAD;
  }

  // check invariant
  tchecker::vm_t & vm = system.vm();
  for (tchecker::loc_id_t loc_id : *vloc) {
    if (vm.run(system.invariant_bytecode(loc_id), *intval, invariant, place_holder_clkreset) == 0)
      return tchecker::STATE_INTVARS_SRC_INVARIANT_VIOLATED;
    assert(place_holder_clkreset.empty());
  }

  return tchecker::STATE_OK;
}